

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard.cpp
# Opt level: O0

void __thiscall GameBoard::handleButtonClick(GameBoard *this,int i,int j)

{
  Field *pFVar1;
  bool bVar2;
  reference this_00;
  reference ppFVar3;
  qsizetype qVar4;
  QString local_78;
  QString local_60;
  QString local_38;
  Field *local_20;
  Field *field;
  int j_local;
  int i_local;
  GameBoard *this_local;
  
  field._0_4_ = j;
  field._4_4_ = i;
  _j_local = this;
  this_00 = QList<QList<Field_*>_>::operator[](&this->grid_,(long)i);
  ppFVar3 = QList<Field_*>::operator[](this_00,(long)(int)field);
  local_20 = *ppFVar3;
  QAbstractButton::text();
  qVar4 = QString::length(&local_38);
  QString::~QString(&local_38);
  pFVar1 = local_20;
  if (qVar4 == 0) {
    if (this->turn_ == Player1) {
      QString::QString(&local_60,"X");
      QAbstractButton::setText((QString *)pFVar1);
      QString::~QString(&local_60);
    }
    else if (this->turn_ == Player2) {
      QString::QString(&local_78,"O");
      QAbstractButton::setText((QString *)pFVar1);
      QString::~QString(&local_78);
    }
    bVar2 = winConditionSatisfied(this);
    if (bVar2) {
      if (this->turn_ == Player1) {
        gameOver(this,1);
      }
      else {
        gameOver(this,2);
      }
      beginNewGame(this);
    }
    this->turn_ = (int)(this->turn_ + Player2) % 2;
  }
  return;
}

Assistant:

void GameBoard::handleButtonClick(int i, int j)
{
    Field* field = grid_[i][j];
    if(field->text().length() != 0) //There is already an X or an O
        return;

    if(turn_ == Turn::Player1)
        field->setText("X");
    else if(turn_ == Turn::Player2)
        field->setText("O");

    if(winConditionSatisfied())
    {
       if(turn_ == Turn::Player1)
           emit gameOver(1);
       else
           emit gameOver(2);
       beginNewGame();
    }

    turn_ = static_cast<Turn>((static_cast<int>(turn_) + 1) % 2);

}